

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osscurses.cc
# Opt level: O2

int oss_eof_on_stdin(void)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval local_98;
  fd_set rfds;
  
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    rfds.fds_bits[lVar2] = 0;
  }
  rfds.fds_bits[0]._0_1_ = (byte)rfds.fds_bits[0] | 1;
  iVar1 = select(1,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return (int)(iVar1 == -1);
}

Assistant:

int
oss_eof_on_stdin()
{
#ifndef MSDOS
    fd_set rfds;
    timeval tv;

    // Zero time: non-blocking operation.
    tv.tv_sec = 0;
    tv.tv_usec = 0;

    FD_ZERO(&rfds);
    // stdin always has a file descriptor of 0.
    FD_SET(0, &rfds);

    return select(1, &rfds, 0, 0, &tv) == -1;
#else
    return _eof(_fileno(stdin)) > 0;
#endif
}